

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vauth.c
# Opt level: O1

char * Curl_auth_build_spn(char *service,char *host,char *realm)

{
  char *pcVar1;
  
  if (realm != (char *)0x0 && host != (char *)0x0) {
    pcVar1 = curl_maprintf("%s/%s@%s",service);
    return pcVar1;
  }
  if (host == (char *)0x0) {
    if (realm == (char *)0x0) {
      return (char *)0x0;
    }
    pcVar1 = "%s@%s";
    host = realm;
  }
  else {
    pcVar1 = "%s/%s";
  }
  pcVar1 = curl_maprintf(pcVar1,service,host);
  return pcVar1;
}

Assistant:

char *Curl_auth_build_spn(const char *service, const char *host,
                          const char *realm)
{
  char *spn = NULL;

  /* Generate our SPN */
  if(host && realm)
    spn = aprintf("%s/%s@%s", service, host, realm);
  else if(host)
    spn = aprintf("%s/%s", service, host);
  else if(realm)
    spn = aprintf("%s@%s", service, realm);

  /* Return our newly allocated SPN */
  return spn;
}